

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall Nova::Driver<float,_2>::Write_Last_Frame(Driver<float,_2> *this,int frame)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  ulong uVar7;
  uint __uval;
  uint __val;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string local_70;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (this->example->output_directory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->example->output_directory)._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_70);
  __val = -frame;
  if (0 < frame) {
    __val = frame;
  }
  uVar8 = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001286a0;
      }
      if (uVar6 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001286a0;
      }
      if (uVar6 < 10000) goto LAB_001286a0;
      uVar7 = uVar7 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar6);
    uVar8 = uVar8 + 1;
  }
LAB_001286a0:
  cVar3 = (char)(frame >> 0x1f);
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar8 - cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50 + ((uint)frame >> 0x1f),uVar8,__val);
  poVar5 = File_Utilities::Safe_Open_Output(&local_70,false);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50,local_48);
  (**(code **)(*(long *)poVar5 + 8))(poVar5);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar2 = (this->example->output_directory)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->example->output_directory)._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_70);
  uVar8 = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001287a4;
      }
      if (uVar6 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001287a4;
      }
      if (uVar6 < 10000) goto LAB_001287a4;
      uVar7 = uVar7 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar6);
    uVar8 = uVar8 + 1;
  }
LAB_001287a4:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar8 - cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50 + ((uint)frame >> 0x1f),uVar8,__val);
  poVar5 = File_Utilities::Safe_Open_Output(&local_70,false);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50,local_48);
  (**(code **)(*(long *)poVar5 + 8))(poVar5);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Driver<T,d>::
Write_Last_Frame(const int frame) const
{
    File_Utilities::Write_To_Text_File(example.output_directory+"/common/last_frame",std::to_string(frame));
    File_Utilities::Write_To_Text_File(example.output_directory+"/info.nova-animation",std::to_string(frame));
}